

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GPrim::get_primvar(GPrim *this,string *varname,GeomPrimvar *out_primvar,string *err)

{
  Attribute *this_00;
  GeomPrimvar *this_01;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  const_iterator cVar4;
  _Base_ptr args;
  _Rb_tree_header *p_Var5;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss;
  string index_name;
  string primvar_name;
  vector<int,_std::allocator<int>_> indices;
  string local_418;
  string local_3f0;
  string local_3d0;
  GeomPrimvar *local_3b0;
  key_type local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  vector<int,_std::allocator<int>_> local_368;
  GeomPrimvar local_350;
  
  if (out_primvar == (GeomPrimvar *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x61c5a5);
      return false;
    }
    return false;
  }
  local_350._name._M_dataplus._M_p = (pointer)&local_350._name.field_2;
  bVar1 = false;
  local_350._name._M_string_length = 0;
  local_350._name.field_2._M_local_buf[0] = '\0';
  local_350._has_value = false;
  local_350._attr._name._M_dataplus._M_p = (pointer)&local_350._attr._name.field_2;
  local_350._attr._name._M_string_length = 0;
  local_350._attr._name.field_2._M_local_buf[0] = '\0';
  local_350._attr._variability = Varying;
  local_350._attr._varying_authored = false;
  local_350._attr._type_name._M_dataplus._M_p = (pointer)&local_350._attr._type_name.field_2;
  local_350._attr._type_name._M_string_length = 0;
  local_350._attr._type_name.field_2._M_local_buf[0] = '\0';
  local_350._attr._var._value.v_.vtable =
       (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_350._attr._var._value.v_.storage.dynamic = (void *)0x0;
  local_350._attr._var._blocked = false;
  local_350._attr._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_350._attr._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_350._attr._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_350._attr._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_350._attr._var._ts._17_8_ = 0;
  local_350._attr._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  local_350._attr._metas.elementSize.has_value_ = false;
  local_350._attr._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  local_350._attr._metas.hidden.has_value_ = false;
  local_350._attr._metas.hidden.contained = (storage_t<bool>)0x0;
  local_350._attr._metas.comment.has_value_ = false;
  local_350._attr._metas.weight.contained = (storage_t<double>)0x0;
  local_350._attr._metas.connectability.has_value_ = false;
  local_350._attr._metas.bindMaterialAs.contained._16_8_ = 0;
  local_350._attr._metas.bindMaterialAs.contained._24_8_ = 0;
  local_350._attr._metas.bindMaterialAs.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.bindMaterialAs.contained._8_8_ = 0;
  args = (_Base_ptr)((long)&local_350._attr._metas.meta + 8);
  local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_350._attr._metas.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.comment.contained._8_8_ = 0;
  local_350._attr._metas.comment.contained._16_8_ = 0;
  local_350._attr._metas.comment.contained._24_8_ = 0;
  local_350._attr._metas.comment.contained._32_8_ = 0;
  local_350._attr._metas.comment.contained._40_8_ = 0;
  local_350._attr._metas.customData.has_value_ = false;
  local_350._attr._metas.customData.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.customData.contained._8_8_ = 0;
  local_350._attr._metas.customData.contained._16_8_ = 0;
  local_350._attr._metas.customData.contained._24_8_ = 0;
  local_350._attr._metas.customData.contained._32_8_ = 0;
  local_350._attr._metas.customData.contained._40_8_ = 0;
  local_350._attr._metas.weight.has_value_ = false;
  local_350._attr._metas.connectability.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.connectability.contained._8_8_ = 0;
  local_350._attr._metas.connectability.contained._16_8_ = 0;
  local_350._attr._metas.connectability.contained._24_8_ = 0;
  local_350._attr._metas.outputName.has_value_ = false;
  local_350._attr._metas.outputName.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.outputName.contained._8_8_ = 0;
  local_350._attr._metas.outputName.contained._16_8_ = 0;
  local_350._attr._metas.outputName.contained._24_8_ = 0;
  local_350._attr._metas.renderType.has_value_ = false;
  local_350._attr._metas.sdrMetadata.has_value_ = false;
  local_350._attr._metas.renderType.contained._16_8_ = 0;
  local_350._attr._metas.renderType.contained._24_8_ = 0;
  local_350._attr._metas.renderType.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.renderType.contained._8_8_ = 0;
  local_350._attr._metas.displayName.has_value_ = false;
  local_350._attr._metas.sdrMetadata.contained._32_8_ = 0;
  local_350._attr._metas.sdrMetadata.contained._40_8_ = 0;
  local_350._attr._metas.sdrMetadata.contained._16_8_ = 0;
  local_350._attr._metas.sdrMetadata.contained._24_8_ = 0;
  local_350._attr._metas.sdrMetadata.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.sdrMetadata.contained._8_8_ = 0;
  local_350._attr._metas.displayGroup.has_value_ = false;
  local_350._attr._metas.displayName.contained._16_8_ = 0;
  local_350._attr._metas.displayName.contained._24_8_ = 0;
  local_350._attr._metas.displayName.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.displayName.contained._8_8_ = 0;
  local_350._attr._metas.bindMaterialAs.has_value_ = false;
  local_350._attr._metas.displayGroup.contained._16_8_ = 0;
  local_350._attr._metas.displayGroup.contained._24_8_ = 0;
  local_350._attr._metas.displayGroup.contained.data.__align =
       (anon_struct_8_0_00000001_for___align)0x0;
  local_350._attr._metas.displayGroup.contained._8_8_ = 0;
  local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_350._attr._153_8_ = 0;
  local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish._0_1_ = 0;
  local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish._1_7_ = 0;
  local_350._unauthoredValuesIndex.has_value_ = false;
  local_350._unauthoredValuesIndex.contained = (storage_t<int>)0x0;
  local_350._elementSize.has_value_ = false;
  local_350._elementSize.contained = (storage_t<unsigned_int>)0x0;
  local_350._interpolation.has_value_ = false;
  local_350._interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  local_350._ts_indices._dirty = false;
  local_350._ts_indices._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_350._ts_indices._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_350._indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_350._ts_indices._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_350._indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_350._indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_350._attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_350._attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_350._attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left = args;
  local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right = args;
  ::std::operator+(&local_388,"primvars:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)varname);
  cVar4 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&(this->props)._M_t,(key_type *)&local_388);
  p_Var5 = &(this->props)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node == p_Var5) goto LAB_00488e2b;
  local_3b0 = out_primvar;
  if (1 < *(uint *)((long)&cVar4._M_node[0x17]._M_parent + 4)) {
    if (err != (string *)0x0) {
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_418,"{} is not Attribute. Maybe Relationship?","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_3a8,(fmt *)&local_418,&local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar1 = false;
    goto LAB_00488e2b;
  }
  GeomPrimvar::set_value(&local_350,(Attribute *)(cVar4._M_node + 2));
  ::std::__cxx11::string::_M_assign((string *)&local_350);
  if (((char)cVar4._M_node[7]._M_color == _S_black) &&
     (local_350._interpolation.contained =
           *(storage_t<tinyusdz::Interpolation> *)&cVar4._M_node[7].field_0x4,
     local_350._interpolation.has_value_ == false)) {
    local_350._interpolation.has_value_ = true;
  }
  if ((*(char *)&cVar4._M_node[7]._M_parent == '\x01') &&
     (local_350._elementSize.contained =
           *(storage_t<unsigned_int> *)((long)&cVar4._M_node[7]._M_parent + 4),
     local_350._elementSize.has_value_ == false)) {
    local_350._elementSize.has_value_ = true;
  }
  bVar1 = AttrMetas::has_unauthoredValuesIndex((AttrMetas *)(cVar4._M_node + 7));
  if ((bVar1) &&
     (local_350._unauthoredValuesIndex.contained =
           (storage_t<int>)AttrMetas::get_unauthoredValuesIndex((AttrMetas *)(cVar4._M_node + 7)),
     local_350._unauthoredValuesIndex.has_value_ == false)) {
    local_350._unauthoredValuesIndex.has_value_ = true;
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  ::std::__cxx11::string::append((char *)&local_3a8);
  cVar4 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&(this->props)._M_t,&local_3a8);
  this_01 = local_3b0;
  if (((_Rb_tree_header *)cVar4._M_node == p_Var5) ||
     (1 < *(uint *)((long)&cVar4._M_node[0x17]._M_parent + 4))) goto LAB_00488df6;
  uVar2 = Attribute::type_id(&local_350._attr);
  if ((uVar2 >> 0x14 & 1) == 0) {
    if (err != (string *)0x0) {
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f0,
                 "Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}"
                 ,"");
      fmt::format<std::__cxx11::string>
                (&local_418,(fmt *)&local_3f0,&local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
    }
LAB_00488e0b:
    bVar1 = false;
  }
  else {
    this_00 = (Attribute *)(cVar4._M_node + 2);
    bVar1 = Attribute::is_connection(this_00);
    if (bVar1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator=
                  ((string *)err,
                   "Attribute Connetion is not supported for index Attribute, since we need Stage info to find Prim referred by targetPath. Use Tydra API tydra::GetGeomPrimvar."
                  );
      }
      goto LAB_00488e0b;
    }
    if (cVar4._M_node[5]._M_left == cVar4._M_node[5]._M_parent) {
      if (cVar4._M_node[4]._M_right == (_Base_ptr)0x0) {
        bVar1 = false;
      }
      else {
        iVar3 = (**(code **)cVar4._M_node[4]._M_right)();
        bVar1 = iVar3 == 4;
      }
      if ((bVar1) || ((cVar4._M_node[5]._M_color & _S_black) != _S_red)) goto LAB_00488df6;
    }
    if (cVar4._M_node[5]._M_left != cVar4._M_node[5]._M_parent) {
      local_418.field_2._M_local_buf[0] = '\0';
      local_418.field_2._M_allocated_capacity._1_7_ = 0;
      local_418.field_2._M_local_buf[8] = '\0';
      local_418._M_dataplus._M_p = (pointer)0x0;
      local_418._M_string_length._0_1_ = 0;
      local_418._M_string_length._1_7_ = 0;
      bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                        ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)&local_418,
                         (TimeSamples *)&cVar4._M_node[5]._M_parent);
      if (bVar1) {
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ::operator=(&local_350._ts_indices._samples,
                    (vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                     *)&local_418);
        args = (_Base_ptr)&local_350._ts_indices;
        local_350._ts_indices._dirty = (bool)local_418.field_2._M_local_buf[8];
      }
      else if (err != (string *)0x0) {
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3d0,
                   "Index Attribute seems not an timesamples with int[] type: {}","");
        fmt::format<std::__cxx11::string>
                  (&local_3f0,(fmt *)&local_3d0,(string *)&local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                 *)&local_418);
      if (!bVar1) goto LAB_00488e0b;
    }
    if (((char)cVar4._M_node[5]._M_color != _S_red) ||
       (((cVar4._M_node[4]._M_right == (_Base_ptr)0x0 ||
         (iVar3 = (**(code **)cVar4._M_node[4]._M_right)(), iVar3 != 0)) &&
        ((cVar4._M_node[4]._M_right == (_Base_ptr)0x0 ||
         (iVar3 = (**(code **)cVar4._M_node[4]._M_right)(), iVar3 != 1)))))) {
      local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar1 = Attribute::get_value<std::vector<int,std::allocator<int>>>(this_00,&local_368);
      if (bVar1) {
        ::std::vector<int,_std::allocator<int>_>::operator=(&local_350._indices,&local_368);
      }
      else if (err != (string *)0x0) {
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f0,"Index Attribute is not int[] type. Got {}","");
        Attribute::type_name_abi_cxx11_(&local_3d0,this_00);
        fmt::format<std::__cxx11::string>
                  (&local_418,(fmt *)&local_3f0,(string *)&local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,
                          CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                   local_418.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar1) goto LAB_00488e0b;
    }
LAB_00488df6:
    GeomPrimvar::operator=(this_01,&local_350);
    bVar1 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
LAB_00488e2b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  GeomPrimvar::~GeomPrimvar(&local_350);
  return bVar1;
}

Assistant:

bool GPrim::get_primvar(const std::string &varname, GeomPrimvar *out_primvar,
                        std::string *err) const {
  if (!out_primvar) {
    SET_ERROR_AND_RETURN("Output GeomPrimvar is nullptr.");
  }

  GeomPrimvar primvar;

  std::string primvar_name = kPrimvars + varname;

  const auto it = props.find(primvar_name);
  if (it == props.end()) {
    return false;
  }

  if (it->second.is_attribute()) {
    const Attribute &attr = it->second.get_attribute();

    primvar.set_value(attr);
    primvar.set_name(varname);
    if (attr.metas().interpolation.has_value()) {
      primvar.set_interpolation(attr.metas().interpolation.value());
    }
    if (attr.metas().elementSize.has_value()) {
      primvar.set_elementSize(attr.metas().elementSize.value());
    }
    if (attr.metas().has_unauthoredValuesIndex()) {
      primvar.set_unauthoredValuesIndex(attr.metas().get_unauthoredValuesIndex());
    }

  } else {
    SET_ERROR_AND_RETURN(fmt::format("{} is not Attribute. Maybe Relationship?", primvar_name));
  }

  // has indices?
  std::string index_name = primvar_name + kIndices;
  const auto indexIt = props.find(index_name);

  if (indexIt != props.end()) {
    if (indexIt->second.is_attribute()) {

      if (!(primvar.get_attribute().type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {
        SET_ERROR_AND_RETURN(
            fmt::format("Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}", primvar_name));
      }

      const Attribute &indexAttr = indexIt->second.get_attribute();

      if (indexAttr.is_connection()) {
        SET_ERROR_AND_RETURN(
            "Attribute Connetion is not supported for index Attribute, since we need Stage info to find Prim referred by targetPath. Use Tydra API tydra::GetGeomPrimvar.");
      }

      if (indexAttr.is_blocked()) {
        // ignore Index attribute.
      } else {

        if (indexAttr.has_timesamples()) {
          const auto &ts = indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            SET_ERROR_AND_RETURN(fmt::format("Index Attribute seems not an timesamples with int[] type: {}", index_name));
          }

          primvar.set_timesampled_indices(tss);
        }

        if (indexAttr.has_value()) {
          // Check if int[] type.
          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!indexAttr.get_value(&indices)) {
            SET_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }

          primvar.set_default_indices(indices);
        }
      }
    } else {
      // indices are optional, so ok to skip it.
    }
  }

  (*out_primvar) = primvar;

  return true;
}